

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void __thiscall ExpressionContext::AddFunction(ExpressionContext *this,FunctionData *function)

{
  char *pcVar1;
  ScopeData *pSVar2;
  undefined1 auVar3 [16];
  uint hash;
  FunctionData *local_18;
  
  local_18 = function;
  SmallArray<FunctionData_*,_2U>::push_back(&this->scope->functions,&local_18);
  local_18->functionIndex = (this->functions).count;
  SmallArray<FunctionData_*,_128U>::push_back(&this->functions,&local_18);
  pcVar1 = (local_18->name->name).begin;
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '$')) {
    pSVar2 = this->scope;
    if ((pSVar2->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
      pSVar2 = this->globalScope;
    }
    hash = InplaceStr::hash(&local_18->name->name);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_18;
    DirectChainedMap<IdentifierLookupResult>::insert
              (&pSVar2->idLookupMap,hash,(IdentifierLookupResult)(auVar3 << 0x40));
  }
  return;
}

Assistant:

void ExpressionContext::AddFunction(FunctionData *function)
{
	scope->functions.push_back(function);

	function->functionIndex = functions.size();

	functions.push_back(function);

	// Don't add internal functions to named lookup
	if(function->name->name.begin && *function->name->name.begin != '$')
	{
		// Type functions are available globally through member accessand namespaced functions are globally accessible through namespace name
		if(scope->type == SCOPE_TYPE || scope->type == SCOPE_NAMESPACE)
			globalScope->idLookupMap.insert(function->name->name.hash(), IdentifierLookupResult(function));
		else
			scope->idLookupMap.insert(function->name->name.hash(), IdentifierLookupResult(function));
	}
}